

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddressTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::net::IPAddress_testResolveAddress_Test::TestBody
          (IPAddress_testResolveAddress_Test *this)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  AssertHelper local_158 [8];
  Message local_150 [16];
  runtime_error *anon_var_0;
  string local_138 [32];
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_118;
  byte local_e9;
  char *pcStack_e8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_d8 [15];
  allocator local_c9;
  string local_c8 [32];
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_a8;
  AssertHelper local_80 [8];
  Message local_78 [15];
  allocator local_69;
  string local_68 [32];
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_48;
  IPAddress_testResolveAddress_Test *local_10;
  IPAddress_testResolveAddress_Test *this_local;
  
  local_10 = this;
  uVar3 = testing::internal::AlwaysTrue();
  if ((uVar3 & 1) == 0) {
    testing::Message::Message(local_78);
    testing::internal::AssertHelper::AssertHelper
              (local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddressTest.cpp"
               ,0x2b,
               "Expected: resolveAddress(\"localhost\", 80, 2, SOCK_STREAM) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::Message::~Message(local_78);
  }
  else {
    bVar1 = testing::internal::AlwaysTrue();
    if ((bVar1 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"localhost",&local_69);
      jaegertracing::net::resolveAddress((string *)&local_48,(int)local_68,0x50,2);
      std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_48);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    uVar3 = testing::internal::AlwaysTrue();
    if ((uVar3 & 1) == 0) {
      testing::Message::Message(local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_msg,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddressTest.cpp"
                 ,0x30,
                 "Expected: resolveAddress(\"123456\", 80, 2, SOCK_STREAM) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
      testing::Message::~Message(local_d8);
    }
    else {
      bVar1 = testing::internal::AlwaysTrue();
      if ((bVar1 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,"123456",&local_c9);
        jaegertracing::net::resolveAddress((string *)&local_a8,(int)local_c8,0x50,2);
        std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_a8);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      }
      testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff18,"");
      bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                        ((ConstCharPtr *)&stack0xffffffffffffff18);
      if (bVar2) {
        local_e9 = 0;
        bVar1 = testing::internal::AlwaysTrue();
        if ((bVar1 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_138,"localhost",(allocator *)((long)&anon_var_0 + 7));
          jaegertracing::net::resolveAddress((string *)&local_118,(int)local_138,0x50,-1);
          std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_118);
          std::__cxx11::string::~string(local_138);
          std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
        }
        if ((local_e9 & 1) != 0) {
          return;
        }
        pcStack_e8 = 
        "Expected: resolveAddress(\"localhost\", 80, -1) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
        ;
      }
      testing::Message::Message(local_150);
      testing::internal::AssertHelper::AssertHelper
                (local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddressTest.cpp"
                 ,0x32,pcStack_e8);
      testing::internal::AssertHelper::operator=(local_158,local_150);
      testing::internal::AssertHelper::~AssertHelper(local_158);
      testing::Message::~Message(local_150);
    }
  }
  return;
}

Assistant:

TEST(IPAddress, testResolveAddress)
{
    ASSERT_NO_THROW(resolveAddress("localhost", 80, AF_INET, SOCK_STREAM));
#ifdef WIN32
    ASSERT_THROW(resolveAddress("123456", 80, AF_INET, SOCK_STREAM),
                 std::runtime_error);
#else
    ASSERT_NO_THROW(resolveAddress("123456", 80, AF_INET, SOCK_STREAM));
#endif
    ASSERT_THROW(resolveAddress("localhost", 80, -1), std::runtime_error);
}